

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

int Llb_Nonlin4CoreReach(Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Llb_Mnx_t *p;
  abctime aVar3;
  
  if (pPars->fVerbose != 0) {
    Aig_ManPrintStats(pAig);
  }
  if ((pPars->fCluster == 0) || (pAig->vObjs->nSize - pAig->nDeleted < 0x8000)) {
    aVar2 = Abc_Clock();
    p = Llb_MnxStart(pAig,pPars);
    if (pPars->fSkipReach == 0) {
      iVar1 = Llb_Nonlin4Reachability(p);
    }
    else {
      iVar1 = -1;
    }
    aVar3 = Abc_Clock();
    p->timeTotal = aVar3 - aVar2;
    Llb_MnxStop(p);
  }
  else {
    puts("The number of objects is more than 2^15.  Clustering cannot be used.");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int Llb_Nonlin4CoreReach( Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    Llb_Mnx_t * pMnn;
    int RetValue = -1;
    if ( pPars->fVerbose )
    Aig_ManPrintStats( pAig );
    if ( pPars->fCluster && Aig_ManObjNum(pAig) >= (1 << 15) )
    {
        printf( "The number of objects is more than 2^15.  Clustering cannot be used.\n" );
        return RetValue;
    }
    {
        abctime clk = Abc_Clock();
        pMnn = Llb_MnxStart( pAig, pPars );
//Llb_MnxCheckNextStateVars( pMnn );
        if ( !pPars->fSkipReach )
            RetValue = Llb_Nonlin4Reachability( pMnn );
        pMnn->timeTotal = Abc_Clock() - clk;
        Llb_MnxStop( pMnn );
    }
    return RetValue;
}